

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O0

void __thiscall Container::close_all_fds(Container *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ContextManager *pCVar5;
  long lVar6;
  Logger *this_00;
  string local_c0;
  string local_a0;
  uint local_7c;
  char *pcStack_78;
  fd_t fd;
  char *end;
  dirent *dentry;
  uint local_48;
  fd_t dir_fd;
  string local_38;
  DIR *local_18;
  DIR *dir;
  Container *this_local;
  
  dir = (DIR *)this;
  local_18 = opendir("/proc/self/fd");
  if (local_18 == (DIR *)0x0) {
    pCVar5 = ContextManager::get();
    format_abi_cxx11_(&local_38,"Cannot open /proc/self/fd: %m");
    (**pCVar5->_vptr_ContextManager)(pCVar5,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  local_48 = dirfd(local_18);
  if ((int)local_48 < 0) {
    pCVar5 = ContextManager::get();
    format_abi_cxx11_((string *)&dentry,"Cannot get fd from DIR*: %m");
    (**pCVar5->_vptr_ContextManager)(pCVar5,(string *)&dentry);
    std::__cxx11::string::~string((string *)&dentry);
  }
  while (end = (char *)readdir(local_18), (dirent *)end != (dirent *)0x0) {
    lVar6 = strtol(((dirent *)end)->d_name,&stack0xffffffffffffff88,10);
    uVar1 = (uint)lVar6;
    local_7c = uVar1;
    if ((((*pcStack_78 == '\0') && (uVar1 != 0)) && (uVar1 != 1)) &&
       ((uVar1 != 2 && (uVar1 != local_48)))) {
      this_00 = Logger::get();
      uVar2 = Logger::get_fd(this_00);
      uVar3 = local_7c;
      if (((uVar1 != uVar2) &&
          ((uVar2 = CgroupController::get_enter_fd(this->memory_controller_), uVar1 = local_7c,
           uVar3 != uVar2 &&
           (uVar3 = CgroupController::get_enter_fd(this->cpuacct_controller_), uVar1 != uVar3)))) &&
         (iVar4 = close(local_7c), iVar4 != 0)) {
        pCVar5 = ContextManager::get();
        format_abi_cxx11_(&local_a0,"Cannot close fd %d: %m",(ulong)local_7c);
        (**pCVar5->_vptr_ContextManager)(pCVar5,&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
      }
    }
  }
  iVar4 = closedir(local_18);
  if (iVar4 != 0) {
    pCVar5 = ContextManager::get();
    format_abi_cxx11_(&local_c0,"Cannot close /proc/: %m");
    (**pCVar5->_vptr_ContextManager)(pCVar5,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  return;
}

Assistant:

void Container::close_all_fds() {
    DIR *dir = opendir("/proc/self/fd");
    if (dir == nullptr) {
        die(format("Cannot open /proc/self/fd: %m"));
    }
    fd_t dir_fd = dirfd(dir);
    if (dir_fd < 0) {
        die(format("Cannot get fd from DIR*: %m"));
    }

    struct dirent *dentry;
    while ((dentry = readdir(dir))) {
        char *end;
        fd_t fd = strtol(dentry->d_name, &end, 10);
        if (*end) continue;

        if (fd == STDIN_FILENO || fd == STDOUT_FILENO || fd == STDERR_FILENO || fd == dir_fd
            || fd == Logger::get().get_fd() || fd == memory_controller_->get_enter_fd()
            || fd == cpuacct_controller_->get_enter_fd())
            continue;
        if (close(fd) != 0) {
            die(format("Cannot close fd %d: %m", fd));
        }
    }

    if (closedir(dir) != 0) {
        die(format("Cannot close /proc/: %m"));
    }
}